

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

jas_image_fmtinfo_t * jas_image_lookupfmtbyname(char *name)

{
  int iVar1;
  jas_image_fmtinfo_t *local_28;
  jas_image_fmtinfo_t *fmtinfo;
  int i;
  char *name_local;
  
  fmtinfo._4_4_ = 0;
  local_28 = jas_image_fmtinfos;
  while( true ) {
    if (jas_image_numfmts <= fmtinfo._4_4_) {
      return (jas_image_fmtinfo_t *)0x0;
    }
    iVar1 = strcmp(local_28->name,name);
    if (iVar1 == 0) break;
    fmtinfo._4_4_ = fmtinfo._4_4_ + 1;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

const jas_image_fmtinfo_t *jas_image_lookupfmtbyname(const char *name)
{
	int i;
	const jas_image_fmtinfo_t *fmtinfo;

	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i, ++fmtinfo) {
		if (!strcmp(fmtinfo->name, name)) {
			return fmtinfo;
		}
	}
	return 0;
}